

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O2

void __thiscall
QWidgetTextControlPrivate::extendWordwiseSelection
          (QWidgetTextControlPrivate *this,int suggestedNewPosition,qreal mouseXPosition)

{
  QWidgetTextControl *this_00;
  undefined1 *puVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  MoveMode MVar8;
  MoveOperation MVar9;
  long in_FS_OFFSET;
  qreal qVar10;
  qreal qVar11;
  double dVar12;
  double dVar13;
  QTextLine QVar14;
  QTextCursor curs;
  undefined1 *local_68;
  QTextEngine *local_60;
  undefined1 *local_58;
  QTextEngine *local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidgetTextControl **)&this->field_0x8;
  iVar3 = QTextCursor::selectionStart();
  if (iVar3 <= suggestedNewPosition) {
    iVar3 = QTextCursor::selectionEnd();
    if (suggestedNewPosition <= iVar3) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        QWidgetTextControl::setTextCursor(this_00,&this->selectedWordOnDoubleClick,false);
        return;
      }
      goto LAB_0047c7de;
    }
  }
  _curs = &DAT_aaaaaaaaaaaaaaaa;
  QTextCursor::QTextCursor(&curs,&this->selectedWordOnDoubleClick);
  MVar9 = (MoveOperation)&curs;
  QTextCursor::setPosition(MVar9,suggestedNewPosition);
  cVar2 = QTextCursor::movePosition(MVar9,5,0);
  if (cVar2 != '\0') {
    iVar3 = QTextCursor::position();
    QTextCursor::block();
    iVar4 = QTextBlock::position();
    QTextCursor::block();
    (**(code **)(*(long *)this_00 + 0x80))(&local_58,this_00,&local_68);
    puVar1 = local_58;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    QVar14 = currentTextLine(&curs);
    local_50 = QVar14.eng;
    local_58 = (undefined1 *)CONCAT44(local_58._4_4_,QVar14.index);
    if (local_50 != (QTextEngine *)0x0) {
      iVar5 = QTextCursor::position();
      qVar10 = QTextLine::cursorToX((QTextLine *)&local_58,iVar5 - iVar4,Leading);
      cVar2 = QTextCursor::movePosition((MoveOperation)&curs,0xe,0);
      if (cVar2 != '\0') {
        iVar5 = QTextCursor::position();
        local_68 = &DAT_aaaaaaaaaaaaaaaa;
        QVar14 = currentTextLine(&curs);
        local_60 = QVar14.eng;
        local_68 = (undefined1 *)CONCAT44(local_68._4_4_,QVar14.index);
        iVar6 = QTextLine::textStart();
        iVar7 = QTextLine::textStart();
        if ((iVar5 != iVar3) && (iVar6 == iVar7)) {
          iVar6 = QTextCursor::position();
          qVar11 = QTextLine::cursorToX((QTextLine *)&local_58,iVar6 - iVar4,Leading);
          if (this->wordSelectionEnabled == false) {
            dVar12 = qVar10 + (double)puVar1;
            if ((mouseXPosition < dVar12) ||
               (dVar13 = (double)puVar1 + qVar11, dVar13 < mouseXPosition)) goto LAB_0047c7b5;
            iVar4 = QTextCursor::position();
            if (suggestedNewPosition < iVar4) {
              MVar8 = QTextCursor::selectionEnd();
            }
            else {
              MVar8 = QTextCursor::selectionStart();
            }
            QTextCursor::setPosition((int)this + 0x88,MVar8);
            if (mouseXPosition - dVar12 < dVar13 - mouseXPosition) {
              iVar5 = iVar3;
            }
          }
          else {
            iVar4 = QTextCursor::position();
            iVar6 = (int)this + 0x88;
            if (suggestedNewPosition < iVar4) {
              MVar8 = QTextCursor::selectionEnd();
              QTextCursor::setPosition(iVar6,MVar8);
              iVar5 = iVar3;
            }
            else {
              MVar8 = QTextCursor::selectionStart();
              QTextCursor::setPosition(iVar6,MVar8);
            }
          }
          setCursorPosition(this,iVar5,KeepAnchor);
          if (((this->interactionFlags).super_QFlagsStorageHelper<Qt::TextInteractionFlag,_4>.
               super_QFlagsStorage<Qt::TextInteractionFlag>.i & 1) != 0) {
            setClipboardSelection(this);
            selectionChanged(this,true);
          }
        }
      }
    }
  }
LAB_0047c7b5:
  QTextCursor::~QTextCursor(&curs);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_0047c7de:
  __stack_chk_fail();
}

Assistant:

void QWidgetTextControlPrivate::extendWordwiseSelection(int suggestedNewPosition, qreal mouseXPosition)
{
    Q_Q(QWidgetTextControl);

    // if inside the initial selected word keep that
    if (suggestedNewPosition >= selectedWordOnDoubleClick.selectionStart()
        && suggestedNewPosition <= selectedWordOnDoubleClick.selectionEnd()) {
        q->setTextCursor(selectedWordOnDoubleClick);
        return;
    }

    QTextCursor curs = selectedWordOnDoubleClick;
    curs.setPosition(suggestedNewPosition, QTextCursor::KeepAnchor);

    if (!curs.movePosition(QTextCursor::StartOfWord))
        return;
    const int wordStartPos = curs.position();

    const int blockPos = curs.block().position();
    const QPointF blockCoordinates = q->blockBoundingRect(curs.block()).topLeft();

    QTextLine line = currentTextLine(curs);
    if (!line.isValid())
        return;

    const qreal wordStartX = line.cursorToX(curs.position() - blockPos) + blockCoordinates.x();

    if (!curs.movePosition(QTextCursor::EndOfWord))
        return;
    const int wordEndPos = curs.position();

    const QTextLine otherLine = currentTextLine(curs);
    if (otherLine.textStart() != line.textStart()
        || wordEndPos == wordStartPos)
        return;

    const qreal wordEndX = line.cursorToX(curs.position() - blockPos) + blockCoordinates.x();

    if (!wordSelectionEnabled && (mouseXPosition < wordStartX || mouseXPosition > wordEndX))
        return;

    if (wordSelectionEnabled) {
        if (suggestedNewPosition < selectedWordOnDoubleClick.position()) {
            cursor.setPosition(selectedWordOnDoubleClick.selectionEnd());
            setCursorPosition(wordStartPos, QTextCursor::KeepAnchor);
        } else {
            cursor.setPosition(selectedWordOnDoubleClick.selectionStart());
            setCursorPosition(wordEndPos, QTextCursor::KeepAnchor);
        }
    } else {
        // keep the already selected word even when moving to the left
        // (#39164)
        if (suggestedNewPosition < selectedWordOnDoubleClick.position())
            cursor.setPosition(selectedWordOnDoubleClick.selectionEnd());
        else
            cursor.setPosition(selectedWordOnDoubleClick.selectionStart());

        const qreal differenceToStart = mouseXPosition - wordStartX;
        const qreal differenceToEnd = wordEndX - mouseXPosition;

        if (differenceToStart < differenceToEnd)
            setCursorPosition(wordStartPos, QTextCursor::KeepAnchor);
        else
            setCursorPosition(wordEndPos, QTextCursor::KeepAnchor);
    }

    if (interactionFlags & Qt::TextSelectableByMouse) {
#ifndef QT_NO_CLIPBOARD
        setClipboardSelection();
#endif
        selectionChanged(true);
    }
}